

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

void __thiscall AddrManImpl::Unserialize<DataStream>(AddrManImpl *this,DataStream *s_)

{
  uint256 *nKey;
  vector<int,_std::allocator<int>_> *this_00;
  unordered_map<int,_AddrInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_AddrInfo>_>_>
  *puVar1;
  unordered_map<CService,_int,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_int>_>_>
  *this_01;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  *this_02;
  int *__args;
  mapped_type mVar2;
  iterator iVar3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  _Hash_node_base *p_Var8;
  undefined8 uVar9;
  undefined1 uVar10;
  bool bVar11;
  Network NVar12;
  int iVar13;
  uint uVar14;
  _Node_const_iterator<std::pair<const_int,_AddrInfo>,_false,_false> __tmp;
  mapped_type *pmVar15;
  key_type *pkVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  Logger *pLVar19;
  ulong uVar20;
  string *psVar21;
  size_t in_RCX;
  SerParams *__nbytes;
  int (*paiVar22) [64];
  undefined4 uVar23;
  int *in_R8;
  LogFlags in_R9;
  int *piVar24;
  int iVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  int check_code;
  int nLostUnk;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bucket_entries;
  int nLost;
  uint8_t lowest_compatible;
  uint8_t compat;
  ParamsStream<DataStream_&,_CAddress::SerParams> s;
  SerParams ser_params;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  int entry_index;
  uint256 serialized_asmap_checksum;
  uint256 supplied_asmap_checksum;
  Level in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 uVar28;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 uVar29;
  int iVar30;
  AddrManImpl *this_03;
  AddrManImpl *args;
  int (*args_1) [64];
  int local_170;
  int local_16c;
  undefined1 local_168 [16];
  long local_158;
  int local_148;
  byte local_142;
  byte local_141;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_140;
  SerParams local_130;
  unique_lock<std::mutex> local_128;
  string local_118;
  undefined1 local_f8 [5];
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  undefined1 local_e8 [16];
  direct_or_indirect local_d8;
  undefined4 local_c8;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  uint16_t local_b8;
  rep local_b0;
  ServiceFlags SStack_a8;
  rep local_a0;
  rep rStack_98;
  direct_or_indirect local_90;
  uint local_80;
  undefined8 local_78;
  NodeSeconds local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128._M_owns = false;
  local_128._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_128);
  if ((this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __assert_fail("vRandom.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                  ,0xeb,"void AddrManImpl::Unserialize(Stream &) [Stream = DataStream]");
  }
  local_d8.indirect_contents.indirect = (char *)0x0;
  DataStream::read(s_,(int)&local_d8,(void *)0x1,in_RCX);
  uVar10 = local_d8.direct[0];
  local_130._1_7_ = 0;
  local_130.super_SerParams.enc._0_1_ = 2 < (byte)local_d8.direct[0];
  __nbytes = &local_130;
  local_140.m_params = __nbytes;
  local_140.m_substream = s_;
  DataStream::read(s_,(int)&local_d8,(void *)0x1,(size_t)__nbytes);
  local_141 = local_d8.direct[0];
  if ((byte)local_d8.direct[0] < 0x20) {
    psVar21 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_char,unsigned_char>
              ((string *)&local_d8.indirect_contents,
               (tinyformat *)
               "Corrupted addrman database: The compat value (%u) is lower than the expected minimum value %u."
               ,(char *)&local_141,
               " /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/banman.cpp"
               ,(uchar *)in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar21);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar21,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_008521a7;
  }
  local_142 = local_d8.direct[0] - 0x20;
  if (4 < local_142) {
    psVar21 = (string *)__cxa_allocate_exception(0x20);
    local_d8.indirect_contents.indirect = (char *)CONCAT71(local_d8._1_7_,uVar10);
    local_f8[0] = 4;
    tinyformat::format<unsigned_char,unsigned_char,char[13],unsigned_char>
              (&local_58,
               (tinyformat *)
               "Unsupported format of addrman database: %u. It is compatible with formats >=%u, but the maximum supported by this version of %s is %u."
               ,local_d8.direct,&local_142,(uchar *)"Bitcoin Core",(char (*) [13])local_f8,
               (uchar *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::ios_base::failure[abi:cxx11]::failure(psVar21);
    *(undefined ***)psVar21 = &PTR__failure_013b58b0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar21,&InvalidAddrManVersionError::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_008521a7;
  }
  nKey = &this->nKey;
  DataStream::read(local_140.m_substream,(int)nKey,(void *)0x20,(size_t)__nbytes);
  DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)__nbytes);
  this->nNew = local_d8._0_4_;
  DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)__nbytes);
  paiVar22 = (int (*) [64])&this->nTried;
  *(undefined4 *)paiVar22 = local_d8._0_4_;
  DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)paiVar22);
  piVar24 = &this->nNew;
  uVar28 = local_d8._0_4_ ^ 0x40000000;
  if (uVar10 == 0) {
    uVar28 = local_d8._0_4_;
  }
  if (0x10000 < (uint)*piVar24) {
    psVar21 = (string *)__cxa_allocate_exception(0x20);
    local_f8._0_4_ = 0x10000;
    tinyformat::format<int,int>
              ((string *)&local_d8.indirect_contents,
               (tinyformat *)"Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
               (char *)piVar24,(int *)local_f8,in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar21);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar21,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_008521a7;
  }
  uVar29 = CONCAT13(uVar10,(int3)in_stack_fffffffffffffe40);
  uVar14 = (*paiVar22)[0];
  if (0x4000 < uVar14) {
    psVar21 = (string *)__cxa_allocate_exception(0x20);
    local_f8._0_4_ = 0x4000;
    tinyformat::format<int,int>
              ((string *)&local_d8.indirect_contents,
               (tinyformat *)"Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
               (char *)paiVar22,(int *)local_f8,in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar21);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar21,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_008521a7;
  }
  this_00 = &this->vRandom;
  auVar5._12_4_ = 0;
  auVar5._0_12_ = stack0xffffffffffffff0c;
  _local_f8 = auVar5 << 0x20;
  iVar30 = 0;
  iVar25 = 0;
  if (*piVar24 != 0) {
    puVar1 = &this->mapInfo;
    this_01 = &this->mapAddr;
    this_02 = &this->m_network_counts;
    do {
      pmVar15 = std::__detail::
                _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)puVar1,(key_type *)local_f8);
      local_d8.indirect_contents.indirect = (char *)&pmVar15->m_last_success;
      in_R8 = &pmVar15->nAttempts;
      ActionUnserialize::
      SerReadWriteMany<ParamsStream<DataStream&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
                (&local_140,&pmVar15->super_CAddress,&pmVar15->source,
                 (Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                  *)&local_d8.indirect_contents,in_R8);
      uVar23 = local_f8._0_4_;
      pkVar16 = (key_type *)
                std::__detail::
                _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_01,(key_type *)pmVar15);
      *pkVar16 = uVar23;
      iVar3._M_current =
           (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pmVar15->nRandomPos =
           (int)((ulong)((long)iVar3._M_current -
                        (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      if (iVar3._M_current ==
          (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this_00,iVar3,(int *)local_f8);
      }
      else {
        *iVar3._M_current = local_f8._0_4_;
        (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      NVar12 = CNetAddr::GetNetwork((CNetAddr *)pmVar15);
      local_d8._0_4_ = NVar12;
      pmVar17 = std::__detail::
                _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_02,(key_type *)local_d8.direct);
      pmVar17->n_new = pmVar17->n_new + 1;
      iVar13 = local_f8._0_4_ + NET_IPV4;
      local_f8._0_4_ = iVar13;
      iVar25 = *piVar24;
    } while (iVar13 < iVar25);
    uVar14 = (*paiVar22)[0];
  }
  this->nIdCount = iVar25;
  local_148 = 0;
  this_03 = this;
  if (0 < (int)uVar14) {
    __args = &this->nIdCount;
    iVar30 = 0;
    iVar25 = 0;
    do {
      AddrInfo::AddrInfo((AddrInfo *)&local_d8.indirect_contents);
      _local_f8 = &local_70;
      in_R8 = (int *)&uStack_68;
      ActionUnserialize::
      SerReadWriteMany<ParamsStream<DataStream&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
                (&local_140,(CAddress *)&local_d8.indirect_contents,
                 (CNetAddr *)&local_90.indirect_contents,
                 (Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                  *)local_f8,in_R8);
      iVar13 = AddrInfo::GetTriedBucket
                         ((AddrInfo *)&local_d8.indirect_contents,nKey,this_03->m_netgroupman);
      uVar14 = AddrInfo::GetBucketPosition
                         ((AddrInfo *)&local_d8.indirect_contents,nKey,false,iVar13);
      bVar11 = CNetAddr::IsValid((CNetAddr *)&local_d8.indirect_contents);
      if (bVar11) {
        lVar7 = (ulong)(uint)(iVar13 << 8) + 0x174;
        if (*(int *)((long)this->vvTried[0] + (ulong)uVar14 * 4 + lVar7 + -0x174) != -1)
        goto LAB_0085183d;
        iVar3._M_current =
             (this_03->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uStack_5c = (undefined4)
                    ((ulong)((long)iVar3._M_current -
                            (long)(this_03->vRandom).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_60 = CONCAT31(local_60._1_3_,1);
        if (iVar3._M_current ==
            (this_03->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)this_00,iVar3,__args);
        }
        else {
          *iVar3._M_current = this_03->nIdCount;
          (this_03->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        pmVar15 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->mapInfo,__args);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)pmVar15,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d8.indirect_contents);
        uVar23 = CONCAT13(cStack_bd,CONCAT12(cStack_be,CONCAT11(cStack_bf,cStack_c0)));
        (pmVar15->super_CAddress).super_CService.super_CNetAddr.m_net = uVar23;
        (pmVar15->super_CAddress).super_CService.super_CNetAddr.m_scope_id =
             (int)(CONCAT17(cStack_b9,
                            CONCAT16(cStack_ba,CONCAT15(cStack_bb,CONCAT14(cStack_bc,uVar23)))) >>
                  0x20);
        (pmVar15->super_CAddress).super_CService.port = local_b8;
        (pmVar15->super_CAddress).nTime.__d.__r = local_b0;
        (pmVar15->super_CAddress).nServices = SStack_a8;
        (pmVar15->m_last_try).__d.__r = local_a0;
        (pmVar15->m_last_count_attempt).__d.__r = rStack_98;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(pmVar15->source).m_addr,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_90.indirect_contents);
        (pmVar15->source).m_net = (undefined4)local_78;
        (pmVar15->source).m_scope_id = local_78._4_4_;
        (pmVar15->m_last_success).__d.__r = (rep)local_70.__d.__r;
        pmVar15->nAttempts = (undefined4)uStack_68;
        pmVar15->nRefCount = uStack_68._4_4_;
        pmVar15->fInTried = (bool)(char)local_60;
        *(int3 *)&pmVar15->field_0x79 = (int3)((uint)local_60 >> 8);
        pmVar15->nRandomPos = uStack_5c;
        mVar2 = *__args;
        pmVar18 = std::__detail::
                  _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->mapAddr,(key_type *)&local_d8.indirect_contents);
        *pmVar18 = mVar2;
        iVar13 = *__args;
        *(int *)((long)this->vvTried[0] + (ulong)uVar14 * 4 + lVar7 + -0x174) = iVar13;
        *__args = iVar13 + 1;
        NVar12 = CNetAddr::GetNetwork((CNetAddr *)&local_d8.indirect_contents);
        local_f8._0_4_ = NVar12;
        pmVar17 = std::__detail::
                  _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->m_network_counts,(key_type *)local_f8);
        pmVar17->n_tried = pmVar17->n_tried + 1;
      }
      else {
LAB_0085183d:
        iVar30 = iVar30 + 1;
        local_148 = iVar30;
      }
      if (0x10 < local_80) {
        free(local_90.indirect_contents.indirect);
        local_90.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_c8) {
        free(local_d8.indirect_contents.indirect);
      }
      iVar25 = iVar25 + 1;
      uVar14 = (*paiVar22)[0];
    } while (iVar25 < (int)uVar14);
  }
  iVar25 = (int)in_R8;
  (*paiVar22)[0] = uVar14 - iVar30;
  local_168 = (undefined1  [16])0x0;
  local_158 = 0;
  auVar6._12_4_ = 0;
  auVar6._0_12_ = stack0xffffffffffffff0c;
  _local_f8 = auVar6 << 0x20;
  args_1 = paiVar22;
  if (0 < (int)uVar28) {
    do {
      DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)paiVar22);
      uVar23 = local_d8._0_4_;
      if (0 < (int)local_d8._0_4_) {
        do {
          local_118._M_dataplus._M_p._0_4_ = 0;
          DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)paiVar22);
          local_118._M_dataplus._M_p._0_4_ = local_d8._0_4_;
          if ((-1 < (int)local_d8._0_4_) && ((int)local_d8._0_4_ < *piVar24)) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<int&,int&>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_168,
                       (int *)local_f8,(int *)&local_118);
          }
          uVar23 = uVar23 + -1;
        } while (uVar23 != 0);
      }
      iVar25 = (int)in_R8;
      iVar13 = local_f8._0_4_ + NET_IPV4;
      local_f8._0_4_ = iVar13;
    } while (iVar13 < (int)uVar28);
  }
  NetGroupManager::GetAsmapChecksum((uint256 *)&local_d8.indirect_contents,this_03->m_netgroupman);
  local_e8 = (undefined1  [16])0x0;
  _local_f8 = (undefined1  [16])0x0;
  if (1 < (byte)((uint)uVar29 >> 0x18)) {
    DataStream::read(local_140.m_substream,(int)local_f8,(void *)0x20,(size_t)paiVar22);
  }
  if (uVar28 == 0x400) {
    auVar27[0] = -((char)local_c8 == local_e8[0]);
    auVar27[1] = -(local_c8._1_1_ == local_e8[1]);
    auVar27[2] = -(local_c8._2_1_ == local_e8[2]);
    auVar27[3] = -(local_c8._3_1_ == local_e8[3]);
    auVar27[4] = -(cStack_c4 == local_e8[4]);
    auVar27[5] = -(cStack_c3 == local_e8[5]);
    auVar27[6] = -(cStack_c2 == local_e8[6]);
    auVar27[7] = -(cStack_c1 == local_e8[7]);
    auVar27[8] = -(cStack_c0 == local_e8[8]);
    auVar27[9] = -(cStack_bf == local_e8[9]);
    auVar27[10] = -(cStack_be == local_e8[10]);
    auVar27[0xb] = -(cStack_bd == local_e8[0xb]);
    auVar27[0xc] = -(cStack_bc == local_e8[0xc]);
    auVar27[0xd] = -(cStack_bb == local_e8[0xd]);
    auVar27[0xe] = -(cStack_ba == local_e8[0xe]);
    auVar27[0xf] = -(cStack_b9 == local_e8[0xf]);
    auVar26[0] = -(local_d8.direct[0] == local_f8[0]);
    auVar26[1] = -(local_d8.direct[1] == local_f8[1]);
    auVar26[2] = -(local_d8.direct[2] == local_f8[2]);
    auVar26[3] = -(local_d8.direct[3] == local_f8[3]);
    auVar26[4] = -(local_d8.direct[4] == local_f8[4]);
    auVar26[5] = -(local_d8.direct[5] == cStack_f3);
    auVar26[6] = -(local_d8.direct[6] == cStack_f2);
    auVar26[7] = -(local_d8.direct[7] == cStack_f1);
    auVar26[8] = -(local_d8.direct[8] == cStack_f0);
    auVar26[9] = -(local_d8.direct[9] == cStack_ef);
    auVar26[10] = -(local_d8.direct[10] == cStack_ee);
    auVar26[0xb] = -(local_d8.direct[0xb] == cStack_ed);
    auVar26[0xc] = -(local_d8.direct[0xc] == cStack_ec);
    auVar26[0xd] = -(local_d8.direct[0xd] == cStack_eb);
    auVar26[0xe] = -(local_d8.direct[0xe] == cStack_ea);
    auVar26[0xf] = -(local_d8.direct[0xf] == cStack_e9);
    auVar26 = auVar26 & auVar27;
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00851b2f;
    uVar28 = 0xff01;
  }
  else {
LAB_00851b2f:
    pLVar19 = LogInstance();
    bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar19,ADDRMAN,Debug);
    if (bVar11) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
      source_file._M_len = 0x54;
      logging_function._M_str = "Unserialize";
      logging_function._M_len = 0xb;
      ::LogPrintf_<>(logging_function,source_file,iVar25,in_R9,in_stack_fffffffffffffe38,
                     (char *)CONCAT44(iVar30,uVar29));
    }
    uVar28 = 0;
  }
  uVar9 = local_168._8_8_;
  if (local_168._0_8_ != local_168._8_8_) {
    puVar1 = &this_03->mapInfo;
    args_1 = this_03->vvNew;
    piVar24 = (int *)local_168._0_8_;
    do {
      iVar25 = *piVar24;
      local_118._M_dataplus._M_p._0_4_ = piVar24[1];
      pmVar15 = std::__detail::
                _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)puVar1,(key_type *)&local_118);
      bVar11 = CNetAddr::IsValid((CNetAddr *)pmVar15);
      if ((bVar11) && (pmVar15->nRefCount < 8)) {
        uVar14 = AddrInfo::GetBucketPosition(pmVar15,nKey,true,iVar25);
        if ((char)uVar28 == '\0') {
LAB_00851c05:
          iVar25 = AddrInfo::GetNewBucket(pmVar15,nKey,&pmVar15->source,this_03->m_netgroupman);
          uVar14 = AddrInfo::GetBucketPosition(pmVar15,nKey,true,iVar25);
          paiVar22 = (int (*) [64])((long)*args_1 + (ulong)(uint)(iVar25 << 8));
          uVar20 = (ulong)uVar14;
          if ((*paiVar22)[uVar20] != -1) goto LAB_00851c5c;
        }
        else {
          paiVar22 = args_1 + iVar25;
          uVar20 = (ulong)uVar14;
          if ((*paiVar22)[uVar20] != -1) goto LAB_00851c05;
        }
        (*paiVar22)[uVar20] = (int)local_118._M_dataplus._M_p;
        pmVar15->nRefCount = pmVar15->nRefCount + 1;
      }
LAB_00851c5c:
      piVar24 = piVar24 + 2;
    } while (piVar24 != (int *)uVar9);
  }
  local_16c = 0;
  iVar25 = 0;
  p_Var8 = (this_03->mapInfo)._M_h._M_before_begin._M_nxt;
  args = this_03;
  while (p_Var8 != (_Hash_node_base *)0x0) {
    if ((*(char *)&p_Var8[0x11]._M_nxt == '\0') && (*(int *)((long)&p_Var8[0x10]._M_nxt + 4) == 0))
    {
      p_Var4 = p_Var8->_M_nxt;
      Delete(this_03,*(int *)&p_Var8[1]._M_nxt);
      iVar25 = iVar25 + 1;
      p_Var8 = p_Var4;
      local_16c = iVar25;
    }
    else {
      p_Var8 = p_Var8->_M_nxt;
    }
  }
  if (iVar25 + iVar30 != 0 && SCARRY4(iVar25,iVar30) == iVar25 + iVar30 < 0) {
    pLVar19 = LogInstance();
    bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar19,ADDRMAN,Debug);
    if (bVar11) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
      source_file_00._M_len = 0x54;
      logging_function_00._M_str = "Unserialize";
      logging_function_00._M_len = 0xb;
      LogPrintf_<int,int>(logging_function_00,source_file_00,(int)&local_16c,(LogFlags)&local_148,
                          in_stack_fffffffffffffe38,(char *)CONCAT44(iVar30,uVar29),(int *)args,
                          *args_1);
    }
  }
  local_170 = CheckAddrman(this_03);
  if (local_170 == 0) {
    if ((void *)local_168._0_8_ != (void *)0x0) {
      operator_delete((void *)local_168._0_8_,local_158 - local_168._0_8_);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_128);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    psVar21 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<int>
              (&local_118,"Corrupt data. Consistency check failed with code %s",&local_170);
    std::ios_base::failure[abi:cxx11]::failure(psVar21);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar21,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_008521a7:
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Unserialize(Stream& s_)
{
    LOCK(cs);

    assert(vRandom.empty());

    Format format;
    s_ >> Using<CustomUintFormatter<1>>(format);

    const auto ser_params = (format >= Format::V3_BIP155 ? CAddress::V2_DISK : CAddress::V1_DISK);
    ParamsStream s{s_, ser_params};

    uint8_t compat;
    s >> compat;
    if (compat < INCOMPATIBILITY_BASE) {
        throw std::ios_base::failure(strprintf(
            "Corrupted addrman database: The compat value (%u) "
            "is lower than the expected minimum value %u.",
            compat, INCOMPATIBILITY_BASE));
    }
    const uint8_t lowest_compatible = compat - INCOMPATIBILITY_BASE;
    if (lowest_compatible > FILE_FORMAT) {
        throw InvalidAddrManVersionError(strprintf(
            "Unsupported format of addrman database: %u. It is compatible with formats >=%u, "
            "but the maximum supported by this version of %s is %u.",
            uint8_t{format}, lowest_compatible, PACKAGE_NAME, uint8_t{FILE_FORMAT}));
    }

    s >> nKey;
    s >> nNew;
    s >> nTried;
    int nUBuckets = 0;
    s >> nUBuckets;
    if (format >= Format::V1_DETERMINISTIC) {
        nUBuckets ^= (1 << 30);
    }

    if (nNew > ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nNew < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                    nNew,
                    ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    if (nTried > ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nTried < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                    nTried,
                    ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    // Deserialize entries from the new table.
    for (int n = 0; n < nNew; n++) {
        AddrInfo& info = mapInfo[n];
        s >> info;
        mapAddr[info] = n;
        info.nRandomPos = vRandom.size();
        vRandom.push_back(n);
        m_network_counts[info.GetNetwork()].n_new++;
    }
    nIdCount = nNew;

    // Deserialize entries from the tried table.
    int nLost = 0;
    for (int n = 0; n < nTried; n++) {
        AddrInfo info;
        s >> info;
        int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
        int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);
        if (info.IsValid()
                && vvTried[nKBucket][nKBucketPos] == -1) {
            info.nRandomPos = vRandom.size();
            info.fInTried = true;
            vRandom.push_back(nIdCount);
            mapInfo[nIdCount] = info;
            mapAddr[info] = nIdCount;
            vvTried[nKBucket][nKBucketPos] = nIdCount;
            nIdCount++;
            m_network_counts[info.GetNetwork()].n_tried++;
        } else {
            nLost++;
        }
    }
    nTried -= nLost;

    // Store positions in the new table buckets to apply later (if possible).
    // An entry may appear in up to ADDRMAN_NEW_BUCKETS_PER_ADDRESS buckets,
    // so we store all bucket-entry_index pairs to iterate through later.
    std::vector<std::pair<int, int>> bucket_entries;

    for (int bucket = 0; bucket < nUBuckets; ++bucket) {
        int num_entries{0};
        s >> num_entries;
        for (int n = 0; n < num_entries; ++n) {
            int entry_index{0};
            s >> entry_index;
            if (entry_index >= 0 && entry_index < nNew) {
                bucket_entries.emplace_back(bucket, entry_index);
            }
        }
    }

    // If the bucket count and asmap checksum haven't changed, then attempt
    // to restore the entries to the buckets/positions they were in before
    // serialization.
    uint256 supplied_asmap_checksum{m_netgroupman.GetAsmapChecksum()};
    uint256 serialized_asmap_checksum;
    if (format >= Format::V2_ASMAP) {
        s >> serialized_asmap_checksum;
    }
    const bool restore_bucketing{nUBuckets == ADDRMAN_NEW_BUCKET_COUNT &&
        serialized_asmap_checksum == supplied_asmap_checksum};

    if (!restore_bucketing) {
        LogDebug(BCLog::ADDRMAN, "Bucketing method was updated, re-bucketing addrman entries from disk\n");
    }

    for (auto bucket_entry : bucket_entries) {
        int bucket{bucket_entry.first};
        const int entry_index{bucket_entry.second};
        AddrInfo& info = mapInfo[entry_index];

        // Don't store the entry in the new bucket if it's not a valid address for our addrman
        if (!info.IsValid()) continue;

        // The entry shouldn't appear in more than
        // ADDRMAN_NEW_BUCKETS_PER_ADDRESS. If it has already, just skip
        // this bucket_entry.
        if (info.nRefCount >= ADDRMAN_NEW_BUCKETS_PER_ADDRESS) continue;

        int bucket_position = info.GetBucketPosition(nKey, true, bucket);
        if (restore_bucketing && vvNew[bucket][bucket_position] == -1) {
            // Bucketing has not changed, using existing bucket positions for the new table
            vvNew[bucket][bucket_position] = entry_index;
            ++info.nRefCount;
        } else {
            // In case the new table data cannot be used (bucket count wrong or new asmap),
            // try to give them a reference based on their primary source address.
            bucket = info.GetNewBucket(nKey, m_netgroupman);
            bucket_position = info.GetBucketPosition(nKey, true, bucket);
            if (vvNew[bucket][bucket_position] == -1) {
                vvNew[bucket][bucket_position] = entry_index;
                ++info.nRefCount;
            }
        }
    }

    // Prune new entries with refcount 0 (as a result of collisions or invalid address).
    int nLostUnk = 0;
    for (auto it = mapInfo.cbegin(); it != mapInfo.cend(); ) {
        if (it->second.fInTried == false && it->second.nRefCount == 0) {
            const auto itCopy = it++;
            Delete(itCopy->first);
            ++nLostUnk;
        } else {
            ++it;
        }
    }
    if (nLost + nLostUnk > 0) {
        LogDebug(BCLog::ADDRMAN, "addrman lost %i new and %i tried addresses due to collisions or invalid addresses\n", nLostUnk, nLost);
    }

    const int check_code{CheckAddrman()};
    if (check_code != 0) {
        throw std::ios_base::failure(strprintf(
            "Corrupt data. Consistency check failed with code %s",
            check_code));
    }
}